

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

void __thiscall
mapbox::detail::Earcut<unsigned_int>::splitEarcut(Earcut<unsigned_int> *this,Node *start)

{
  bool bVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *b;
  
  pNVar4 = start;
  do {
    pNVar2 = pNVar4->prev;
    pNVar3 = pNVar4->next;
    b = pNVar3->next;
    if (b != pNVar2) {
      do {
        if (pNVar4->i != b->i) {
          bVar1 = isValidDiagonal(this,pNVar4,b);
          if (bVar1) {
            pNVar3 = splitPolygon(this,pNVar4,b);
            pNVar4 = filterPoints(this,pNVar4,pNVar4->next);
            pNVar3 = filterPoints(this,pNVar3,pNVar3->next);
            earcutLinked(this,pNVar4,0);
            earcutLinked(this,pNVar3,0);
            return;
          }
          pNVar2 = pNVar4->prev;
        }
        b = b->next;
      } while (b != pNVar2);
      pNVar3 = pNVar4->next;
    }
    pNVar4 = pNVar3;
  } while (pNVar3 != start);
  return;
}

Assistant:

void Earcut<N>::splitEarcut(Node* start) {
    // look for a valid diagonal that divides the polygon into two
    Node* a = start;
    do {
        Node* b = a->next->next;
        while (b != a->prev) {
            if (a->i != b->i && isValidDiagonal(a, b)) {
                // split the polygon in two by the diagonal
                Node* c = splitPolygon(a, b);

                // filter colinear points around the cuts
                a = filterPoints(a, a->next);
                c = filterPoints(c, c->next);

                // run earcut on each half
                earcutLinked(a);
                earcutLinked(c);
                return;
            }
            b = b->next;
        }
        a = a->next;
    } while (a != start);
}